

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O0

void __thiscall
cppjieba::KeywordExtractor::LoadStopWordDict(KeywordExtractor *this,string *filePath)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  ostream *poVar4;
  Logger *this_00;
  istream *piVar5;
  size_type sVar6;
  string *in_RSI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  string line;
  ifstream ifs;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  string local_3c8 [36];
  int in_stack_fffffffffffffc5c;
  char *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  Logger *in_stack_fffffffffffffc70;
  istream local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    limonp::Logger::Logger
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc5c);
    poVar4 = limonp::Logger::Stream((Logger *)(local_3c8 + 0x20));
    poVar4 = std::operator<<(poVar4,"exp: [ifs.is_open()");
    this_00 = (Logger *)std::operator<<(poVar4,"] false. ");
    poVar4 = std::operator<<((ostream *)this_00,"open ");
    poVar4 = std::operator<<(poVar4,local_10);
    std::operator<<(poVar4," failed");
    limonp::Logger::~Logger(this_00);
  }
  std::__cxx11::string::string(local_3c8);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_3c8);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    pVar7 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(bVar2,in_stack_fffffffffffffbe0),
                     (value_type *)in_stack_fffffffffffffbd8._M_cur);
    in_stack_fffffffffffffbd8._M_cur =
         (__node_type *)
         pVar7.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
  }
  sVar6 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x198c33);
  if (sVar6 != 0) {
    std::__cxx11::string::~string(local_3c8);
    std::ifstream::~ifstream(local_218);
    return;
  }
  __assert_fail("stopWords_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/KeywordExtractor.hpp"
                ,0x83,"void cppjieba::KeywordExtractor::LoadStopWordDict(const string &)");
}

Assistant:

void LoadStopWordDict(const string& filePath) {
    ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed";
    string line ;
    while (getline(ifs, line)) {
      stopWords_.insert(line);
    }
    assert(stopWords_.size());
  }